

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxmlstream.cpp
# Opt level: O0

qsizetype __thiscall QXmlStreamReaderPrivate::fastScanSpace(QXmlStreamReaderPrivate *this)

{
  QXmlStreamReaderPrivate *this_00;
  QXmlStreamReaderPrivate *in_RDI;
  long in_FS_OFFSET;
  uint c;
  qsizetype n;
  undefined8 in_stack_ffffffffffffffb8;
  uint local_2c;
  long local_28;
  QXmlStreamReaderPrivate *this_01;
  QChar local_a;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_28 = 0;
  this_01 = in_RDI;
LAB_006567d6:
  local_2c = getChar(this_01);
  if (local_2c != 0xffffffff) {
    this_00 = (QXmlStreamReaderPrivate *)(ulong)(local_2c - 9);
    switch(this_00) {
    case (QXmlStreamReaderPrivate *)0x0:
    case (QXmlStreamReaderPrivate *)0x17:
      goto switchD_00656817_caseD_0;
    default:
      putChar(this_00,(uint)((ulong)in_stack_ffffffffffffffb8 >> 0x20));
      break;
    case (QXmlStreamReaderPrivate *)0x4:
      local_2c = filterCarriageReturn(in_RDI);
      if (local_2c == 0) break;
    case (QXmlStreamReaderPrivate *)0x1:
      in_RDI->lineNumber = in_RDI->lineNumber + 1;
      in_RDI->lastLineStart = in_RDI->characterOffset + in_RDI->readBufferPos;
      goto switchD_00656817_caseD_0;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_28;
  }
  __stack_chk_fail();
switchD_00656817_caseD_0:
  QChar::QChar<unsigned_int,_true>(&local_a,local_2c);
  QString::operator+=((QString *)this_00,(QChar)(char16_t)((ulong)in_RDI >> 0x30));
  local_28 = local_28 + 1;
  goto LAB_006567d6;
}

Assistant:

inline qsizetype QXmlStreamReaderPrivate::fastScanSpace()
{
    qsizetype n = 0;
    uint c;
    while ((c = getChar()) != StreamEOF) {
        switch (c) {
        case '\r':
            if ((c = filterCarriageReturn()) == 0)
                return n;
            Q_FALLTHROUGH();
        case '\n':
            ++lineNumber;
            lastLineStart = characterOffset + readBufferPos;
            Q_FALLTHROUGH();
        case ' ':
        case '\t':
            textBuffer += QChar(c);
            ++n;
            break;
        default:
            putChar(c);
            return n;
        }
    }
    return n;
}